

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O3

uint32_t __thiscall
cfd::core::ConfidentialTransaction::AddTxIn
          (ConfidentialTransaction *this,Txid *txid,uint32_t index,uint32_t sequence,
          Script *unlocking_script)

{
  void *pvVar1;
  pointer pCVar2;
  pointer pCVar3;
  Txid *txid_00;
  bool bVar4;
  CfdException *pCVar5;
  uint index_00;
  int ret;
  size_t is_coinbase;
  ConfidentialTxIn txin;
  int local_33c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_338;
  Txid *local_318;
  long local_310;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_308;
  ConfidentialTxIn local_2f0;
  ConfidentialTxIn local_190;
  
  if ((long)(this->vin_).
            super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(this->vin_).
            super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
            ._M_impl.super__Vector_impl_data._M_start == 0x15ffffffea0) {
    local_2f0.super_AbstractTxIn._vptr_AbstractTxIn = (_func_int **)0x21f267;
    local_2f0.super_AbstractTxIn.txid_._vptr_Txid._0_4_ = 0x5ee;
    local_2f0.super_AbstractTxIn.txid_.data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "AddTxIn";
    logger::log<>((CfdSourceLocation *)&local_2f0,kCfdLogLevelWarning,"vin maximum.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_2f0.super_AbstractTxIn._vptr_AbstractTxIn =
         (_func_int **)&local_2f0.super_AbstractTxIn.txid_.data_;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"txin maximum.","");
    CfdException::CfdException(pCVar5,kCfdIllegalStateError,(string *)&local_2f0);
    __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
  }
  pvVar1 = (this->super_AbstractTransaction).wally_tx_pointer_;
  local_318 = txid;
  Txid::GetData((ByteData *)&local_2f0,txid);
  ByteData::GetBytes(&local_308,(ByteData *)&local_2f0);
  if (local_2f0.super_AbstractTxIn._vptr_AbstractTxIn != (_func_int **)0x0) {
    operator_delete(local_2f0.super_AbstractTxIn._vptr_AbstractTxIn);
  }
  bVar4 = Script::IsEmpty(unlocking_script);
  if (bVar4) {
    local_338.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_338.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_338.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    Script::GetData((ByteData *)&local_2f0,unlocking_script);
    ByteData::GetBytes(&local_338,(ByteData *)&local_2f0);
    if (local_2f0.super_AbstractTxIn._vptr_AbstractTxIn != (_func_int **)0x0) {
      operator_delete(local_2f0.super_AbstractTxIn._vptr_AbstractTxIn);
    }
  }
  local_33c = wally_tx_add_elements_raw_input
                        (pvVar1,local_308.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                         (long)local_308.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_308.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,index,sequence,
                         local_338.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (long)local_338.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_338.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,0,0,0,0,0,0,0,0,0,0,0,0,0,0,
                         0);
  if (local_33c != 0) {
    local_2f0.super_AbstractTxIn._vptr_AbstractTxIn = (_func_int **)0x21f267;
    local_2f0.super_AbstractTxIn.txid_._vptr_Txid._0_4_ = 0x5fe;
    local_2f0.super_AbstractTxIn.txid_.data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "AddTxIn";
    logger::log<int&>((CfdSourceLocation *)&local_2f0,kCfdLogLevelWarning,
                      "wally_tx_add_elements_raw_input NG[{}].",&local_33c);
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_2f0.super_AbstractTxIn._vptr_AbstractTxIn =
         (_func_int **)&local_2f0.super_AbstractTxIn.txid_.data_;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"txin add error.","");
    CfdException::CfdException(pCVar5,kCfdIllegalStateError,(string *)&local_2f0);
    __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_310 = 0;
  wally_tx_is_coinbase(pvVar1);
  txid_00 = local_318;
  index_00 = index & 0x3fffffff;
  if (local_310 != 0) {
    index_00 = index;
  }
  ConfidentialTxIn::ConfidentialTxIn(&local_2f0,local_318,index_00,sequence);
  bVar4 = Script::IsEmpty(unlocking_script);
  if (!bVar4) {
    ConfidentialTxIn::ConfidentialTxIn(&local_190,txid_00,index_00,sequence,unlocking_script);
    ConfidentialTxIn::operator=(&local_2f0,&local_190);
    ConfidentialTxIn::~ConfidentialTxIn(&local_190);
  }
  ::std::vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>::
  push_back(&this->vin_,&local_2f0);
  pCVar2 = (this->vin_).
           super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pCVar3 = (this->vin_).
           super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ConfidentialTxIn::~ConfidentialTxIn(&local_2f0);
  if (local_338.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_338.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_308.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_308.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return (int)((ulong)((long)pCVar3 - (long)pCVar2) >> 5) * -0x45d1745d - 1;
}

Assistant:

uint32_t ConfidentialTransaction::AddTxIn(
    const Txid &txid, uint32_t index, uint32_t sequence,
    const Script &unlocking_script) {
  if (vin_.size() == std::numeric_limits<uint32_t>::max()) {
    warn(CFD_LOG_SOURCE, "vin maximum.");
    throw CfdException(kCfdIllegalStateError, "txin maximum.");
  }

  struct wally_tx *tx_pointer =
      static_cast<struct wally_tx *>(wally_tx_pointer_);
  const std::vector<uint8_t> &txid_buf = txid.GetData().GetBytes();
  std::vector<uint8_t> empty_data;
  const std::vector<uint8_t> &script_data =
      (unlocking_script.IsEmpty()) ? empty_data
                                   : unlocking_script.GetData().GetBytes();
  int ret = wally_tx_add_elements_raw_input(
      tx_pointer, txid_buf.data(), txid_buf.size(), index, sequence,
      script_data.data(), script_data.size(), NULL, NULL, 0, NULL, 0, NULL, 0,
      NULL, 0, NULL, 0, NULL, 0, NULL, 0);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_add_elements_raw_input NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "txin add error.");
  }

  size_t is_coinbase = 0;
  wally_tx_is_coinbase(tx_pointer, &is_coinbase);
  uint32_t set_index = (is_coinbase == 0) ? index & kTxInVoutMask : index;
  ConfidentialTxIn txin(txid, set_index, sequence);
  if (!unlocking_script.IsEmpty()) {
    txin = ConfidentialTxIn(txid, set_index, sequence, unlocking_script);
  }
  vin_.push_back(txin);
  return static_cast<uint32_t>(vin_.size() - 1);
}